

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

uint8_t __thiscall
ans_byte_decode::decode_sym(ans_byte_decode *this,uint64_t *state,uint8_t **in_u8)

{
  reference pvVar1;
  long *in_RDX;
  ulong *in_RSI;
  long in_RDI;
  uint32_t *in_ptr_u32;
  value_type *entry;
  
  pvVar1 = std::vector<dec_entry,_std::allocator<dec_entry>_>::operator[]
                     ((vector<dec_entry,_std::allocator<dec_entry>_> *)(in_RDI + 0x420),
                      *in_RSI & *(ulong *)(in_RDI + 0x408));
  *in_RSI = (ulong)pvVar1->freq * (*in_RSI >> ((byte)*(undefined8 *)(in_RDI + 0x410) & 0x3f)) +
            (ulong)pvVar1->offset;
  if (*in_RSI < *(ulong *)(in_RDI + 0x418)) {
    *in_RDX = *in_RDX + -4;
    *in_RSI = *in_RSI << 0x20 | (ulong)*(uint *)*in_RDX;
  }
  return pvVar1->sym;
}

Assistant:

uint8_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        return entry.sym;
    }